

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

float_specs
fmt::v8::detail::parse_float_type_spec<fmt::v8::detail::error_handler,wchar_t>
          (basic_format_specs<wchar_t> *specs,error_handler *eh)

{
  uint uVar1;
  uint uVar3;
  ulong uVar2;
  
  if (specs->type < chr) {
    uVar3 = *(ushort *)&specs->field_0x9 >> 7 & 1;
    uVar1 = (*(ushort *)&specs->field_0x9 & 0x100) << 9 | uVar3 << 0x14;
    uVar2 = (ulong)uVar1;
    switch(specs->type) {
    case none:
    case general_lower:
      break;
    default:
      goto switchD_001789cd_caseD_1;
    case hexfloat_upper:
      uVar1 = uVar1 | 0x10000;
    case hexfloat_lower:
      uVar2 = (ulong)(uVar1 | 3);
      break;
    case exp_upper:
      uVar1 = uVar1 | 0x10000;
    case exp_lower:
      uVar2 = (ulong)((uVar1 & 0xffffe) + (uVar3 | specs->precision != 0) * 0x100000 + 1);
      break;
    case fixed_upper:
      uVar1 = uVar1 | 0x10000;
    case fixed_lower:
      uVar2 = (ulong)((uVar1 & 0xffffd) + (uVar3 | specs->precision != 0) * 0x100000 + 2);
      break;
    case general_upper:
      uVar2 = (ulong)(uVar1 | 0x10000);
    }
    return (float_specs)(uVar2 << 0x20);
  }
switchD_001789cd_caseD_1:
  fmt::v8::detail::throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR auto parse_float_type_spec(const basic_format_specs<Char>& specs,
                                         ErrorHandler&& eh = {})
    -> float_specs {
  auto result = float_specs();
  result.showpoint = specs.alt;
  result.locale = specs.localized;
  switch (specs.type) {
  case presentation_type::none:
    result.format = float_format::general;
    break;
  case presentation_type::general_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::general_lower:
    result.format = float_format::general;
    break;
  case presentation_type::exp_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::exp_lower:
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::fixed_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::fixed_lower:
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case presentation_type::hexfloat_upper:
    result.upper = true;
    FMT_FALLTHROUGH;
  case presentation_type::hexfloat_lower:
    result.format = float_format::hex;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}